

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

int set_FMPtrField_by_name(FMFieldList field_list,char *fieldname,void *data,void *ptr_value)

{
  int iVar1;
  long lVar2;
  int iVar3;
  FMFieldList p_Var4;
  bool bVar5;
  
  bVar5 = field_list->field_name == (char *)0x0;
  if (bVar5) {
LAB_00122e92:
    iVar3 = 0;
  }
  else {
    iVar1 = strcmp(field_list->field_name,fieldname);
    iVar3 = 0;
    if (iVar1 == 0) {
      lVar2 = 0;
    }
    else {
      p_Var4 = field_list + 1;
      lVar2 = 0;
      do {
        bVar5 = p_Var4->field_name == (char *)0x0;
        if (bVar5) goto LAB_00122e92;
        iVar1 = strcmp(p_Var4->field_name,fieldname);
        p_Var4 = p_Var4 + 1;
        lVar2 = lVar2 + 1;
      } while (iVar1 != 0);
    }
    if (!bVar5) {
      *(void **)((long)data + (long)field_list[lVar2].field_offset) = ptr_value;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

extern int
set_FMPtrField_by_name(FMFieldList field_list, const char *fieldname, void *data, void *ptr_value)
{
    int index;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return 0;

    
    *((void**)(((char*)data) + field_list[index].field_offset)) = ptr_value;
    return 1;
}